

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

char * get_netscape_format(Cookie *co)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  char *local_78;
  char *local_50;
  char *local_38;
  Cookie *co_local;
  
  pcVar1 = "";
  if ((co->httponly & 1U) != 0) {
    pcVar1 = "#HttpOnly_";
  }
  bVar5 = false;
  if (((co->tailmatch & 1U) != 0) && (bVar5 = false, co->domain != (char *)0x0)) {
    bVar5 = *co->domain != '.';
  }
  pcVar2 = "";
  if (bVar5) {
    pcVar2 = ".";
  }
  if (co->domain == (char *)0x0) {
    local_38 = "unknown";
  }
  else {
    local_38 = co->domain;
  }
  pcVar3 = "FALSE";
  if ((co->tailmatch & 1U) != 0) {
    pcVar3 = "TRUE";
  }
  if (co->path == (char *)0x0) {
    local_50 = "/";
  }
  else {
    local_50 = co->path;
  }
  pcVar4 = "FALSE";
  if ((co->secure & 1U) != 0) {
    pcVar4 = "TRUE";
  }
  if (co->value == (char *)0x0) {
    local_78 = "";
  }
  else {
    local_78 = co->value;
  }
  pcVar1 = curl_maprintf("%s%s%s\t%s\t%s\t%s\t%ld\t%s\t%s",pcVar1,pcVar2,local_38,pcVar3,local_50,
                         pcVar4,co->expires,co->name,local_78);
  return pcVar1;
}

Assistant:

static char *get_netscape_format(const struct Cookie *co)
{
  return aprintf(
    "%s"     /* httponly preamble */
    "%s%s\t" /* domain */
    "%s\t"   /* tailmatch */
    "%s\t"   /* path */
    "%s\t"   /* secure */
    "%" CURL_FORMAT_CURL_OFF_T "\t"   /* expires */
    "%s\t"   /* name */
    "%s",    /* value */
    co->httponly?"#HttpOnly_":"",
    /*
     * Make sure all domains are prefixed with a dot if they allow
     * tailmatching. This is Mozilla-style.
     */
    (co->tailmatch && co->domain && co->domain[0] != '.')? ".":"",
    co->domain?co->domain:"unknown",
    co->tailmatch?"TRUE":"FALSE",
    co->path?co->path:"/",
    co->secure?"TRUE":"FALSE",
    co->expires,
    co->name,
    co->value?co->value:"");
}